

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGhsMultiGenerator::VisitTarget
          (cmGlobalGhsMultiGenerator *this,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *temp,set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *perm,
          vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *order,
          cmGeneratorTarget *ti)

{
  _Rb_tree_header *p_Var1;
  pointer *pppcVar2;
  iterator __position;
  bool bVar3;
  _Base_ptr p_Var4;
  TargetDependSet *targets;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  OrderedTargetDependSet sortedTargets;
  cmGeneratorTarget *local_a0;
  string local_98;
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  local_78;
  
  p_Var4 = (perm->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(perm->_M_t)._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(cmGeneratorTarget **)(p_Var4 + 1) >= ti) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(cmGeneratorTarget **)(p_Var4 + 1) < ti];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(cmGeneratorTarget **)(p_Var6 + 1) <= ti)) {
      return false;
    }
  }
  local_a0 = ti;
  pVar7 = std::
          _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
          ::_M_insert_unique<cmGeneratorTarget_const*const&>
                    ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                      *)temp,&local_a0);
  bVar3 = true;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    targets = cmGlobalGenerator::GetTargetDirectDepends(&this->super_cmGlobalGenerator,local_a0);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
    OrderedTargetDependSet::OrderedTargetDependSet
              ((OrderedTargetDependSet *)&local_78,targets,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    for (p_Var5 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &local_78._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      bVar3 = VisitTarget(this,temp,perm,order,*(cmGeneratorTarget **)(p_Var5 + 1));
      if (bVar3) {
        bVar3 = true;
        goto LAB_003a936a;
      }
    }
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_insert_unique<cmGeneratorTarget_const*const&>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)perm,&local_a0);
    __position._M_current =
         (order->
         super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (order->
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
      _M_realloc_insert<cmGeneratorTarget_const*const&>
                ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)order,
                 __position,&local_a0);
    }
    else {
      *__position._M_current = local_a0;
      pppcVar2 = &(order->
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppcVar2 = *pppcVar2 + 1;
    }
    bVar3 = false;
LAB_003a936a:
    std::
    _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
    ::~_Rb_tree(&local_78);
  }
  return bVar3;
}

Assistant:

bool cmGlobalGhsMultiGenerator::VisitTarget(
  std::set<cmGeneratorTarget const*>& temp,
  std::set<cmGeneratorTarget const*>& perm,
  std::vector<cmGeneratorTarget const*>& order, cmGeneratorTarget const* ti)
{
  /* check if permanent mark is set*/
  if (perm.find(ti) == perm.end()) {
    /* set temporary mark; check if revisit*/
    if (temp.insert(ti).second) {
      /* sort targets lexicographically to ensure that nodes are always visited
       * in the same order */
      OrderedTargetDependSet sortedTargets(this->GetTargetDirectDepends(ti),
                                           "");
      for (auto const& di : sortedTargets) {
        if (this->VisitTarget(temp, perm, order, di)) {
          return true;
        }
      }
      /* mark as complete; insert into beginning of list*/
      perm.insert(ti);
      order.push_back(ti);
      return false;
    }
    /* revisiting item - not a DAG */
    return true;
  }
  /* already complete */
  return false;
}